

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

size_type __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::count(hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
        *this,key_type *__key)

{
  bool bVar1;
  size_type __n_00;
  const_reference pp_Var2;
  int *__x;
  value_type local_30;
  _Node *__cur;
  size_type __result;
  size_type __n;
  key_type *__key_local;
  hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  *this_local;
  
  __n_00 = _M_bkt_num_key(this,__key);
  __cur = (_Node *)0x0;
  pp_Var2 = std::
            vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
            operator[](&this->_M_buckets,__n_00);
  for (local_30 = *pp_Var2; local_30 != (value_type)0x0; local_30 = local_30->_M_next) {
    __x = _Identity<int>::operator()((_Identity<int> *)&this->field_0x3,&local_30->_M_val);
    bVar1 = std::equal_to<int>::operator()((equal_to<int> *)&this->field_0x2,__x,__key);
    if (bVar1) {
      __cur = (_Node *)((long)&__cur->_M_next + 1);
    }
  }
  return (size_type)__cur;
}

Assistant:

size_type count(const key_type& __key) const
  {
    const size_type __n = _M_bkt_num_key(__key);
    size_type __result = 0;

    for (const _Node* __cur = _M_buckets[__n]; __cur; __cur = __cur->_M_next)
      if (_M_equals(_M_get_key(__cur->_M_val), __key))
        ++__result;
    return __result;
  }